

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryMappingTests.cpp
# Opt level: O2

TestConfig_conflict *
vkt::memory::anon_unknown_0::subMappedConfig
          (TestConfig_conflict *__return_storage_ptr__,VkDeviceSize allocationSize,
          MemoryRange *mapping,Op op,deUint32 seed)

{
  uint *__a;
  ulong uVar1;
  value_type *__value;
  value_type *__value_00;
  vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
  *this;
  _Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
  local_a0;
  allocator_type *local_88;
  ulong uStack_80;
  undefined1 local_78 [16];
  float *local_68;
  anon_union_8_2_d0736028_for_Maybe<float>_2 aStack_60;
  vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
  local_58;
  vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
  vStack_40;
  bool local_28;
  
  vStack_40.
  super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_40.
  super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.
  super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vStack_40.
  super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68 = (float *)mapping->offset;
  aStack_60 = (anon_union_8_2_d0736028_for_Maybe<float>_2)mapping->size;
  local_28 = false;
  local_78._0_8_ = allocationSize;
  local_78._8_4_ = seed;
  if (OP_BUFFER_BINDMEMORY < op) {
    __return_storage_ptr__->allocationSize = 0xffffffffffffffff;
    *(undefined4 *)&(__return_storage_ptr__->mapping).offset = 0xffffffff;
    *(undefined4 *)((long)&(__return_storage_ptr__->mapping).offset + 4) = 0xffffffff;
    *(undefined4 *)&(__return_storage_ptr__->mapping).size = 0xffffffff;
    *(undefined4 *)((long)&(__return_storage_ptr__->mapping).size + 4) = 0xffffffff;
    (__return_storage_ptr__->flushMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->flushMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->flushMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->invalidateMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->invalidateMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->invalidateMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    goto LAB_0063f265;
  }
  this = &local_58;
  __a = &switchD_0063f006::switchdataD_009c3bc0;
  switch(op) {
  case OP_FLUSH:
    local_88 = (allocator_type *)mapping->offset;
    uStack_80 = mapping->size;
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::vector((vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
              *)&local_a0,(size_type)&local_88,mapping,
             (allocator_type *)&switchD_0063f006::switchdataD_009c3bc0);
    goto LAB_0063f248;
  case OP_MAP_FLUSH:
    local_88 = (allocator_type *)((mapping->size >> 2) + mapping->offset);
    uStack_80 = mapping->size >> 1;
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::vector((vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
              *)&local_a0,(size_type)&local_88,mapping,local_88);
    goto LAB_0063f248;
  case OP_MAP_INVALIDATE:
    uVar1 = mapping->size >> 1;
    local_a0._M_impl.super__Vector_impl_data._M_finish = (pointer)(mapping->size - uVar1);
    local_a0._M_impl.super__Vector_impl_data._M_start = (pointer)(uVar1 + mapping->offset);
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::push_back(this,(value_type *)&local_a0);
    local_a0._M_impl.super__Vector_impl_data._M_start = (pointer)mapping->offset;
    local_a0._M_impl.super__Vector_impl_data._M_finish = (pointer)(mapping->size >> 1);
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::push_back(this,(value_type *)&local_a0);
    break;
  case OP_MAP_READ:
    uVar1 = mapping->size;
    local_a0._M_impl.super__Vector_impl_data._M_start = (pointer)(uVar1 / 3 + mapping->offset);
    local_a0._M_impl.super__Vector_impl_data._M_finish = (pointer)(uVar1 - (uVar1 >> 1));
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::push_back(this,(value_type *)&local_a0);
    local_a0._M_impl.super__Vector_impl_data._M_start = (pointer)mapping->offset;
    local_a0._M_impl.super__Vector_impl_data._M_finish = (pointer)((mapping->size * 2) / 3);
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::push_back(this,(value_type *)&local_a0);
    break;
  case OP_INVALIDATE:
    local_88 = (allocator_type *)mapping->offset;
    uStack_80 = mapping->size;
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::vector((vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
              *)&local_a0,(size_type)&local_88,mapping,
             (allocator_type *)&switchD_0063f006::switchdataD_009c3bc0);
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::operator=(this,(vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
                      *)&local_a0);
    std::
    _Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::~_Vector_base(&local_a0);
    local_88 = (allocator_type *)mapping->offset;
    uStack_80 = mapping->size;
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::vector((vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
              *)&local_a0,(size_type)&local_88,__value,(allocator_type *)__a);
    goto LAB_0063f23e;
  case OP_MAP_MODIFY:
    local_88 = (allocator_type *)((mapping->size >> 2) + mapping->offset);
    uStack_80 = mapping->size >> 1;
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::vector((vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
              *)&local_a0,(size_type)&local_88,mapping,local_88);
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::operator=(this,(vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
                      *)&local_a0);
    std::
    _Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::~_Vector_base(&local_a0);
    local_88 = (allocator_type *)((mapping->size >> 2) + mapping->offset);
    uStack_80 = mapping->size >> 1;
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::vector((vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
              *)&local_a0,(size_type)&local_88,__value_00,local_88);
LAB_0063f23e:
    this = &vStack_40;
LAB_0063f248:
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::operator=(this,(vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
                      *)&local_a0);
    std::
    _Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::~_Vector_base(&local_a0);
    break;
  case OP_BUFFER_CREATE:
    uVar1 = mapping->size >> 1;
    local_a0._M_impl.super__Vector_impl_data._M_finish = (pointer)(mapping->size - uVar1);
    local_a0._M_impl.super__Vector_impl_data._M_start = (pointer)(uVar1 + mapping->offset);
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::push_back(this,(value_type *)&local_a0);
    local_a0._M_impl.super__Vector_impl_data._M_start = (pointer)mapping->offset;
    local_a0._M_impl.super__Vector_impl_data._M_finish = (pointer)(mapping->size >> 1);
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::push_back(this,(value_type *)&local_a0);
    uVar1 = mapping->size >> 1;
    local_a0._M_impl.super__Vector_impl_data._M_finish = (pointer)(mapping->size - uVar1);
    local_a0._M_impl.super__Vector_impl_data._M_start = (pointer)(uVar1 + mapping->offset);
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::push_back(&vStack_40,(value_type *)&local_a0);
    local_a0._M_impl.super__Vector_impl_data._M_start = (pointer)mapping->offset;
    local_a0._M_impl.super__Vector_impl_data._M_finish = (pointer)(mapping->size >> 1);
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::push_back(&vStack_40,(value_type *)&local_a0);
    break;
  case OP_BUFFER_DESTROY:
    uVar1 = mapping->size;
    local_a0._M_impl.super__Vector_impl_data._M_start = (pointer)(uVar1 / 3 + mapping->offset);
    local_a0._M_impl.super__Vector_impl_data._M_finish = (pointer)(uVar1 - (uVar1 >> 1));
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::push_back(this,(value_type *)&local_a0);
    local_a0._M_impl.super__Vector_impl_data._M_start = (pointer)mapping->offset;
    local_a0._M_impl.super__Vector_impl_data._M_finish = (pointer)((mapping->size * 2) / 3);
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::push_back(this,(value_type *)&local_a0);
    uVar1 = mapping->size;
    local_a0._M_impl.super__Vector_impl_data._M_start = (pointer)(uVar1 / 3 + mapping->offset);
    local_a0._M_impl.super__Vector_impl_data._M_finish = (pointer)(uVar1 - (uVar1 >> 1));
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::push_back(&vStack_40,(value_type *)&local_a0);
    local_a0._M_impl.super__Vector_impl_data._M_start = (pointer)mapping->offset;
    local_a0._M_impl.super__Vector_impl_data._M_finish = (pointer)((mapping->size * 2) / 3);
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::push_back(&vStack_40,(value_type *)&local_a0);
    break;
  case OP_BUFFER_BINDMEMORY:
    local_28 = true;
    goto LAB_0063f25d;
  }
LAB_0063f25d:
  TestConfig::TestConfig(__return_storage_ptr__,(TestConfig_conflict *)local_78);
LAB_0063f265:
  TestConfig::~TestConfig((TestConfig *)local_78);
  return __return_storage_ptr__;
}

Assistant:

TestConfig subMappedConfig (VkDeviceSize				allocationSize,
							const MemoryRange&			mapping,
							Op							op,
							deUint32					seed)
{
	TestConfig config;

	config.allocationSize	= allocationSize;
	config.seed				= seed;
	config.mapping			= mapping;
	config.remap			= false;

	switch (op)
	{
		case OP_NONE:
			return config;

		case OP_REMAP:
			config.remap = true;
			return config;

		case OP_FLUSH:
			config.flushMappings = vector<MemoryRange>(1, MemoryRange(mapping.offset, mapping.size));
			return config;

		case OP_SUB_FLUSH:
			DE_ASSERT(mapping.size / 4 > 0);

			config.flushMappings = vector<MemoryRange>(1, MemoryRange(mapping.offset + mapping.size / 4, mapping.size / 2));
			return config;

		case OP_SUB_FLUSH_SEPARATE:
			DE_ASSERT(mapping.size / 2 > 0);

			config.flushMappings.push_back(MemoryRange(mapping.offset + mapping.size /  2, mapping.size - (mapping.size / 2)));
			config.flushMappings.push_back(MemoryRange(mapping.offset, mapping.size / 2));

			return config;

		case OP_SUB_FLUSH_OVERLAPPING:
			DE_ASSERT((mapping.size / 3) > 0);

			config.flushMappings.push_back(MemoryRange(mapping.offset + mapping.size /  3, mapping.size - (mapping.size / 2)));
			config.flushMappings.push_back(MemoryRange(mapping.offset, (2 * mapping.size) / 3));

			return config;

		case OP_INVALIDATE:
			config.flushMappings = vector<MemoryRange>(1, MemoryRange(mapping.offset, mapping.size));
			config.invalidateMappings = vector<MemoryRange>(1, MemoryRange(mapping.offset, mapping.size));
			return config;

		case OP_SUB_INVALIDATE:
			DE_ASSERT(mapping.size / 4 > 0);

			config.flushMappings = vector<MemoryRange>(1, MemoryRange(mapping.offset + mapping.size / 4, mapping.size / 2));
			config.invalidateMappings = vector<MemoryRange>(1, MemoryRange(mapping.offset + mapping.size / 4, mapping.size / 2));
			return config;

		case OP_SUB_INVALIDATE_SEPARATE:
			DE_ASSERT(mapping.size / 2 > 0);

			config.flushMappings.push_back(MemoryRange(mapping.offset + mapping.size /  2, mapping.size - (mapping.size / 2)));
			config.flushMappings.push_back(MemoryRange(mapping.offset, mapping.size / 2));

			config.invalidateMappings.push_back(MemoryRange(mapping.offset + mapping.size /  2, mapping.size - (mapping.size / 2)));
			config.invalidateMappings.push_back(MemoryRange(mapping.offset, mapping.size / 2));

			return config;

		case OP_SUB_INVALIDATE_OVERLAPPING:
			DE_ASSERT((mapping.size / 3) > 0);

			config.flushMappings.push_back(MemoryRange(mapping.offset + mapping.size /  3, mapping.size - (mapping.size / 2)));
			config.flushMappings.push_back(MemoryRange(mapping.offset, (2 * mapping.size) / 3));

			config.invalidateMappings.push_back(MemoryRange(mapping.offset + mapping.size /  3, mapping.size - (mapping.size / 2)));
			config.invalidateMappings.push_back(MemoryRange(mapping.offset, (2 * mapping.size) / 3));

			return config;

		default:
			DE_FATAL("Unknown Op");
			return TestConfig();
	}
}